

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O1

EnumClass __thiscall
phmap::priv::hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
          (Generator<phmap::priv::hash_internal::EnumClass,_void> *this)

{
  mt19937_64 *__urng;
  EnumClass EVar1;
  uniform_int_distribution<unsigned_long> dist;
  uniform_int_distribution<unsigned_long> local_20;
  
  local_20._M_param._M_a = 0;
  local_20._M_param._M_b = 0xffffffffffffffff;
  do {
    __urng = GetSharedRng();
    EVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_20,__urng,&local_20._M_param);
  } while (EVar1 < 2);
  return EVar1;
}

Assistant:

EnumClass operator()() const {
        std::uniform_int_distribution<
            typename std::underlying_type<EnumClass>::type> dist;
        while (true) {
            EnumClass variate = static_cast<EnumClass>(dist(*GetSharedRng()));
            if (variate != EnumClass::kEmpty && variate != EnumClass::kDeleted)
                return static_cast<EnumClass>(variate);
        }
    }